

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

int __thiscall QMainWindowLayoutState::remove(QMainWindowLayoutState *this,char *__filename)

{
  QObject *object;
  QWidget *dockWidget;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QToolBarAreaLayout::remove(&this->toolBarAreaLayout,__filename);
  object = (QObject *)(**(code **)(*(long *)__filename + 0x68))(__filename);
  dockWidget = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(object)->super_QWidget;
  if (dockWidget != (QWidget *)0x0) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayout::indexOf((QList<int> *)&local_38,&this->dockAreaLayout,dockWidget);
    if ((undefined1 *)local_38.size != (undefined1 *)0x0) {
      QDockAreaLayout::remove(&this->dockAreaLayout,(char *)&local_38);
    }
    QArrayDataPointer<int>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::remove(QLayoutItem *item)
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.remove(item);
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (QDockWidget *dockWidget = qobject_cast<QDockWidget *>(item->widget())) {
        QList<int> path = dockAreaLayout.indexOf(dockWidget);
        if (!path.isEmpty())
            dockAreaLayout.remove(path);
    }
#endif // QT_CONFIG(dockwidget)
}